

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tremove(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  int local_18;
  int pos;
  int size;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  iVar1 = luaL_len(L,1);
  lVar2 = luaL_optinteger(L,2,(long)iVar1);
  local_18 = (int)lVar2;
  if ((local_18 != iVar1) && ((local_18 < 1 || (iVar1 + 1 < local_18)))) {
    luaL_argerror(L,1,"position out of bounds");
  }
  lua_rawgeti(L,1,local_18);
  for (; local_18 < iVar1; local_18 = local_18 + 1) {
    lua_rawgeti(L,1,local_18 + 1);
    lua_rawseti(L,1,local_18);
  }
  lua_pushnil(L);
  lua_rawseti(L,1,local_18);
  return 1;
}

Assistant:

static int tremove (lua_State *L) {
  int size = aux_getn(L, 1);
  int pos = luaL_optint(L, 2, size);
  if (pos != size)  /* validate 'pos' if given */
    luaL_argcheck(L, 1 <= pos && pos <= size + 1, 1, "position out of bounds");
  lua_rawgeti(L, 1, pos);  /* result = t[pos] */
  for ( ; pos < size; pos++) {
    lua_rawgeti(L, 1, pos+1);
    lua_rawseti(L, 1, pos);  /* t[pos] = t[pos+1] */
  }
  lua_pushnil(L);
  lua_rawseti(L, 1, pos);  /* t[pos] = nil */
  return 1;
}